

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

uint openjtalk_getSamplingFrequency(OpenJTalk *oj)

{
  undefined8 in_RAX;
  size_t sVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  _Bool error;
  _Bool local_11;
  
  local_11 = SUB81((ulong)in_RAX >> 0x38,0);
  if (oj != (OpenJTalk *)0x0) {
    oj->errorCode = OPENJTALKERROR_NO_ERROR;
    sVar1 = Open_JTalk_get_sampling_frequency(oj->open_jtalk,&local_11);
    if (local_11 == true) {
      oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
      uVar2 = 0;
    }
    else {
      auVar3._8_4_ = (int)(sVar1 >> 0x20);
      auVar3._0_8_ = sVar1;
      auVar3._12_4_ = 0x45300000;
      dVar4 = (auVar3._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
      uVar2 = (ulong)dVar4;
      uVar2 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
      oj->sampling_frequency = uVar2;
    }
    return (uint)uVar2;
  }
  g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  return 0;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getSamplingFrequency(OpenJTalk *oj)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	bool error;
	double res = Open_JTalk_get_sampling_frequency(oj->open_jtalk, &error);
	if (error)
	{
		oj->errorCode = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}
	oj->sampling_frequency = res;
	return oj->sampling_frequency;
}